

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool run_container_add(run_container_t *run,uint16_t pos)

{
  int32_t lenarray;
  rle16_t *prVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  prVar1 = run->runs;
  lenarray = run->n_runs;
  uVar3 = interleavedBinarySearch(prVar1,lenarray,pos);
  if ((int)uVar3 < 0) {
    uVar7 = ~uVar3;
    if (uVar3 == 0xffffffff) {
      if ((lenarray < 1) || (pos + 1 != (uint)prVar1->value)) {
LAB_00113cab:
        makeRoomAtIndex(run,(uint16_t)uVar7);
        prVar1 = run->runs;
        prVar1[uVar7].value = pos;
        prVar1[uVar7].length = 0;
      }
      else {
        prVar1->length = prVar1->length + 1;
        prVar1->value = prVar1->value - 1;
      }
    }
    else {
      uVar4 = -uVar3 - 2;
      uVar3 = (uint)pos;
      iVar6 = uVar3 - prVar1[uVar4].value;
      if (iVar6 <= (int)(uint)prVar1[uVar4].length) goto LAB_00113c04;
      iVar5 = prVar1[uVar4].length + 1;
      if (iVar6 == iVar5) {
        if (((int)uVar7 < lenarray) && (uVar3 + 1 == (uint)prVar1[uVar7].value)) {
          prVar1[uVar4].length = (prVar1[uVar7].value - prVar1[uVar4].value) + prVar1[uVar7].length;
          recoverRoomAtIndex(run,(uint16_t)uVar7);
        }
        else {
          prVar1[uVar4].length = (uint16_t)iVar5;
        }
      }
      else {
        if ((lenarray <= (int)uVar7) || (uVar3 + 1 != (uint)prVar1[uVar7].value)) goto LAB_00113cab;
        prVar1[uVar7].value = pos;
        prVar1[uVar7].length = prVar1[uVar7].length + 1;
      }
    }
    _Var2 = true;
  }
  else {
LAB_00113c04:
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool run_container_add(run_container_t *run, uint16_t pos) {
    int32_t index = interleavedBinarySearch(run->runs, run->n_runs, pos);
    if (index >= 0) return false;  // already there
    index = -index - 2;            // points to preceding value, possibly -1
    if (index >= 0) {              // possible match
        int32_t offset = pos - run->runs[index].value;
        int32_t le = run->runs[index].length;
        if (offset <= le) return false;  // already there
        if (offset == le + 1) {
            // we may need to fuse
            if (index + 1 < run->n_runs) {
                if (run->runs[index + 1].value == pos + 1) {
                    // indeed fusion is needed
                    run->runs[index].length = run->runs[index + 1].value +
                                              run->runs[index + 1].length -
                                              run->runs[index].value;
                    recoverRoomAtIndex(run, (uint16_t)(index + 1));
                    return true;
                }
            }
            run->runs[index].length++;
            return true;
        }
        if (index + 1 < run->n_runs) {
            // we may need to fuse
            if (run->runs[index + 1].value == pos + 1) {
                // indeed fusion is needed
                run->runs[index + 1].value = pos;
                run->runs[index + 1].length = run->runs[index + 1].length + 1;
                return true;
            }
        }
    }
    if (index == -1) {
        // we may need to extend the first run
        if (0 < run->n_runs) {
            if (run->runs[0].value == pos + 1) {
                run->runs[0].length++;
                run->runs[0].value--;
                return true;
            }
        }
    }
    makeRoomAtIndex(run, (uint16_t)(index + 1));
    run->runs[index + 1].value = pos;
    run->runs[index + 1].length = 0;
    return true;
}